

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_path_rect_to(nk_draw_list *list,nk_vec2 a,nk_vec2 b,float rounding)

{
  nk_vec2 center;
  nk_vec2 center_00;
  nk_vec2 center_01;
  nk_vec2 center_02;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  float in_XMM1_Da;
  float in_XMM1_Db;
  float in_XMM2_Da;
  float r;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  nk_vec2 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  int a_max;
  undefined8 in_stack_ffffffffffffff80;
  nk_draw_list *in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff90;
  float fVar1;
  undefined4 local_68;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_8;
  undefined4 uStack_4;
  
  a_max = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  if (in_RDI != 0) {
    local_8 = (float)in_XMM0_Qa;
    if (0.0 <= in_XMM1_Da - local_8) {
      local_58 = in_XMM1_Da - local_8;
    }
    else {
      local_58 = -(in_XMM1_Da - local_8);
    }
    local_5c = in_XMM2_Da;
    if (local_58 <= in_XMM2_Da) {
      if (0.0 <= in_XMM1_Da - local_8) {
        local_60 = in_XMM1_Da - local_8;
      }
      else {
        local_60 = -(in_XMM1_Da - local_8);
      }
      local_5c = local_60;
    }
    uStack_4 = (float)((ulong)in_XMM0_Qa >> 0x20);
    if (0.0 <= in_XMM1_Db - uStack_4) {
      local_68 = in_XMM1_Db - uStack_4;
    }
    else {
      local_68 = -(in_XMM1_Db - uStack_4);
    }
    if (local_68 <= local_5c) {
      if (0.0 <= in_XMM1_Db - uStack_4) {
        in_stack_ffffffffffffff90 = in_XMM1_Db - uStack_4;
        local_5c = in_stack_ffffffffffffff90;
      }
      else {
        in_stack_ffffffffffffff90 = -(in_XMM1_Db - uStack_4);
        local_5c = in_stack_ffffffffffffff90;
      }
    }
    if ((local_5c != 0.0) || (NAN(local_5c))) {
      fVar1 = local_5c;
      nk_vec2(local_8 + local_5c,uStack_4 + local_5c);
      center.y = fVar1;
      center.x = in_stack_ffffffffffffff90;
      nk_draw_list_path_arc_to_fast
                (in_stack_ffffffffffffff88,center,(float)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                 (int)in_stack_ffffffffffffff80,a_max);
      nk_vec2(in_XMM1_Da - local_5c,uStack_4 + local_5c);
      center_00.y = fVar1;
      center_00.x = in_stack_ffffffffffffff90;
      nk_draw_list_path_arc_to_fast
                (in_stack_ffffffffffffff88,center_00,
                 (float)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80,
                 a_max);
      nk_vec2(in_XMM1_Da - local_5c,in_XMM1_Db - local_5c);
      center_01.y = fVar1;
      center_01.x = in_stack_ffffffffffffff90;
      nk_draw_list_path_arc_to_fast
                (in_stack_ffffffffffffff88,center_01,
                 (float)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80,
                 a_max);
      nk_vec2(local_8 + local_5c,in_XMM1_Db - local_5c);
      center_02.y = fVar1;
      center_02.x = in_stack_ffffffffffffff90;
      nk_draw_list_path_arc_to_fast
                (in_stack_ffffffffffffff88,center_02,
                 (float)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80,
                 (int)((ulong)in_RDI >> 0x20));
    }
    else {
      nk_draw_list_path_line_to
                ((nk_draw_list *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 in_stack_ffffffffffffff70);
      nk_vec2(in_XMM1_Da,uStack_4);
      nk_draw_list_path_line_to
                ((nk_draw_list *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 in_stack_ffffffffffffff70);
      nk_draw_list_path_line_to
                ((nk_draw_list *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 in_stack_ffffffffffffff70);
      nk_vec2(local_8,in_XMM1_Db);
      nk_draw_list_path_line_to
                ((nk_draw_list *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 in_stack_ffffffffffffff70);
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_path_rect_to(struct nk_draw_list *list, struct nk_vec2 a,
struct nk_vec2 b, float rounding)
{
float r;
NK_ASSERT(list);
if (!list) return;
r = rounding;
r = NK_MIN(r, ((b.x-a.x) < 0) ? -(b.x-a.x): (b.x-a.x));
r = NK_MIN(r, ((b.y-a.y) < 0) ? -(b.y-a.y): (b.y-a.y));

if (r == 0.0f) {
nk_draw_list_path_line_to(list, a);
nk_draw_list_path_line_to(list, nk_vec2(b.x,a.y));
nk_draw_list_path_line_to(list, b);
nk_draw_list_path_line_to(list, nk_vec2(a.x,b.y));
} else {
nk_draw_list_path_arc_to_fast(list, nk_vec2(a.x + r, a.y + r), r, 6, 9);
nk_draw_list_path_arc_to_fast(list, nk_vec2(b.x - r, a.y + r), r, 9, 12);
nk_draw_list_path_arc_to_fast(list, nk_vec2(b.x - r, b.y - r), r, 0, 3);
nk_draw_list_path_arc_to_fast(list, nk_vec2(a.x + r, b.y - r), r, 3, 6);
}
}